

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

clock_t Data::times(tms *__buffer)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  clock_t cVar4;
  long *plVar5;
  
  plVar5 = (long *)__buffer->tms_utime;
  if (*plVar5 == 0) {
    cVar4 = 0;
  }
  else {
    cVar4 = 0;
    lVar3 = __dynamic_cast(*plVar5,&typeinfo,&Integer::typeinfo,0);
    if (lVar3 != 0) {
      cVar4 = Integer::times(__buffer);
      plVar5 = (long *)__buffer->tms_utime;
    }
  }
  plVar1 = (long *)__buffer->tms_stime;
  if (plVar5 != plVar1) {
    do {
      plVar2 = (long *)*plVar5;
      if ((plVar2 != (long *)0x0) && ((int)plVar2[1] == 0)) {
        (**(code **)(*plVar2 + 8))();
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != plVar1);
    plVar5 = (long *)__buffer->tms_utime;
  }
  if (plVar5 != (long *)0x0) {
    operator_delete(plVar5);
  }
  operator_delete(__buffer);
  return cVar4;
}

Assistant:

Data *Data::times(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::times(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}